

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

string * __thiscall
particleSamples::gz_readline_abi_cxx11_
          (string *__return_storage_ptr__,particleSamples *this,gzFile gzfp)

{
  int iVar1;
  char buffer [1];
  stringstream line;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&line);
  iVar1 = gzread(gzfp,buffer,1);
  while ((iVar1 == 1 && (buffer[0] != '\n'))) {
    std::operator<<(local_1a0,buffer[0]);
    iVar1 = gzread(gzfp,buffer,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&line);
  return __return_storage_ptr__;
}

Assistant:

string particleSamples::gz_readline(gzFile gzfp) {
    std::stringstream line;
    char buffer[1];
    int len = gzread(gzfp, buffer, 1);
    while (len == 1 && buffer[0] != '\n') {
        line << buffer[0];
        len = gzread(gzfp, buffer, 1);
    }
    return (line.str());
}